

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O1

bool __thiscall SQTable::NewSlot(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  _HashNode *p_Var4;
  SQTable *pSVar5;
  ulong uVar6;
  _HashNode *p_Var7;
  _HashNode *p_Var8;
  ulong uVar9;
  ulong uVar10;
  _HashNode *p_Var11;
  
  do {
    SVar2 = (key->super_SQObject)._type;
    if ((int)SVar2 < 0x5000004) {
      if ((SVar2 == OT_BOOL) || (SVar2 == OT_INTEGER)) {
        uVar6 = (key->super_SQObject)._unVal.nInteger;
      }
      else {
LAB_0012b42b:
        uVar6 = (key->super_SQObject)._unVal.nInteger >> 3;
      }
    }
    else if (SVar2 == OT_FLOAT) {
      uVar6 = (ulong)(key->super_SQObject)._unVal.fFloat;
    }
    else {
      if (SVar2 != OT_STRING) goto LAB_0012b42b;
      uVar6 = ((key->super_SQObject)._unVal.pString)->_hash;
    }
    uVar9 = this->_numofnodes - 1;
    uVar6 = uVar6 & uVar9;
    p_Var11 = this->_nodes + uVar6;
    p_Var8 = p_Var11;
    do {
      if (((p_Var8->key).super_SQObject._unVal.pTable == (key->super_SQObject)._unVal.pTable) &&
         ((p_Var8->key).super_SQObject._type == SVar2)) goto LAB_0012b470;
      p_Var8 = p_Var8->next;
    } while (p_Var8 != (_HashNode *)0x0);
    p_Var8 = (_HashNode *)0x0;
LAB_0012b470:
    if (p_Var8 != (_HashNode *)0x0) {
      SVar2 = (p_Var8->val).super_SQObject._type;
      pSVar5 = (p_Var8->val).super_SQObject._unVal.pTable;
      (p_Var8->val).super_SQObject._unVal = (val->super_SQObject)._unVal;
      SVar3 = (val->super_SQObject)._type;
      (p_Var8->val).super_SQObject._type = SVar3;
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(((p_Var8->val).super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      return false;
    }
    SVar2 = (p_Var11->key).super_SQObject._type;
    if (SVar2 != OT_NULL) {
      if ((int)SVar2 < 0x5000004) {
        if ((SVar2 == OT_BOOL) || (SVar2 == OT_INTEGER)) {
          uVar10 = (p_Var11->key).super_SQObject._unVal.nInteger;
        }
        else {
LAB_0012b4c4:
          uVar10 = (p_Var11->key).super_SQObject._unVal.nInteger >> 3;
        }
      }
      else if (SVar2 == OT_FLOAT) {
        uVar10 = (ulong)(p_Var11->key).super_SQObject._unVal.fFloat;
      }
      else {
        if (SVar2 != OT_STRING) goto LAB_0012b4c4;
        uVar10 = ((p_Var11->key).super_SQObject._unVal.pString)->_hash;
      }
      p_Var8 = this->_firstfree;
      if ((p_Var8 < p_Var11) && (uVar10 = uVar10 & uVar9, uVar10 != uVar6)) {
        p_Var4 = this->_nodes + uVar10;
        do {
          p_Var7 = p_Var4;
          p_Var4 = p_Var7->next;
        } while (p_Var4 != p_Var11);
        p_Var7->next = p_Var8;
        SVar2 = (p_Var8->key).super_SQObject._type;
        pSVar5 = (p_Var8->key).super_SQObject._unVal.pTable;
        (p_Var8->key).super_SQObject._unVal = (p_Var11->key).super_SQObject._unVal;
        SVar3 = (p_Var11->key).super_SQObject._type;
        (p_Var8->key).super_SQObject._type = SVar3;
        if ((SVar3 >> 0x1b & 1) != 0) {
          pSVar1 = &(((p_Var8->key).super_SQObject._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        SVar2 = (p_Var8->val).super_SQObject._type;
        pSVar5 = (p_Var8->val).super_SQObject._unVal.pTable;
        (p_Var8->val).super_SQObject._unVal = (p_Var11->val).super_SQObject._unVal;
        SVar3 = (p_Var11->val).super_SQObject._type;
        (p_Var8->val).super_SQObject._type = SVar3;
        if ((SVar3 >> 0x1b & 1) != 0) {
          pSVar1 = &(((p_Var8->val).super_SQObject._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        p_Var8->next = p_Var11->next;
        pSVar5 = (p_Var11->key).super_SQObject._unVal.pTable;
        SVar2 = (p_Var11->key).super_SQObject._type;
        (p_Var11->key).super_SQObject._type = OT_NULL;
        (p_Var11->key).super_SQObject._unVal.pTable = (SQTable *)0x0;
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        pSVar5 = (p_Var11->val).super_SQObject._unVal.pTable;
        SVar2 = (p_Var11->val).super_SQObject._type;
        (p_Var11->val).super_SQObject._type = OT_NULL;
        (p_Var11->val).super_SQObject._unVal.pTable = (SQTable *)0x0;
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        p_Var11->next = (_HashNode *)0x0;
      }
      else {
        p_Var8->next = p_Var11->next;
        p_Var11->next = p_Var8;
        p_Var11 = p_Var8;
      }
    }
    SVar2 = (p_Var11->key).super_SQObject._type;
    pSVar5 = (p_Var11->key).super_SQObject._unVal.pTable;
    (p_Var11->key).super_SQObject._unVal = (key->super_SQObject)._unVal;
    SVar3 = (key->super_SQObject)._type;
    (p_Var11->key).super_SQObject._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(((p_Var11->key).super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    p_Var8 = this->_firstfree;
    while( true ) {
      if (((p_Var8->key).super_SQObject._type == OT_NULL) && (p_Var8->next == (_HashNode *)0x0)) {
        SVar2 = (p_Var11->val).super_SQObject._type;
        pSVar5 = (p_Var11->val).super_SQObject._unVal.pTable;
        (p_Var11->val).super_SQObject._unVal = (val->super_SQObject)._unVal;
        SVar3 = (val->super_SQObject)._type;
        (p_Var11->val).super_SQObject._type = SVar3;
        if ((SVar3 >> 0x1b & 1) != 0) {
          pSVar1 = &(((p_Var11->val).super_SQObject._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        this->_usednodes = this->_usednodes + 1;
        return true;
      }
      if (p_Var8 == this->_nodes) break;
      p_Var8 = p_Var8 + -1;
      this->_firstfree = p_Var8;
    }
    Rehash(this,true);
  } while( true );
}

Assistant:

bool SQTable::NewSlot(const SQObjectPtr &key,const SQObjectPtr &val)
{
    assert(type(key) != OT_NULL);
    SQHash h = HashObj(key) & (_numofnodes - 1);
    _HashNode *n = _Get(key, h);
    if (n) {
        n->val = val;
        return false;
    }
    _HashNode *mp = &_nodes[h];
    n = mp;


    //key not found I'll insert it
    //main pos is not free

    if(type(mp->key) != OT_NULL) {
        n = _firstfree;  /* get a free place */
        SQHash mph = HashObj(mp->key) & (_numofnodes - 1);
        _HashNode *othern;  /* main position of colliding node */

        if (mp > n && (othern = &_nodes[mph]) != mp){
            /* yes; move colliding node into free position */
            while (othern->next != mp){
                assert(othern->next != NULL);
                othern = othern->next;  /* find previous */
            }
            othern->next = n;  /* redo the chain with `n' in place of `mp' */
            n->key = mp->key;
            n->val = mp->val;/* copy colliding node into free pos. (mp->next also goes) */
            n->next = mp->next;
            mp->key.Null();
            mp->val.Null();
            mp->next = NULL;  /* now `mp' is free */
        }
        else{
            /* new node will go into free position */
            n->next = mp->next;  /* chain new position */
            mp->next = n;
            mp = n;
        }
    }
    mp->key = key;

    for (;;) {  /* correct `firstfree' */
        if (type(_firstfree->key) == OT_NULL && _firstfree->next == NULL) {
            mp->val = val;
            _usednodes++;
            return true;  /* OK; table still has a free place */
        }
        else if (_firstfree == _nodes) break;  /* cannot decrement from here */
        else (_firstfree)--;
    }
    Rehash(true);
    return NewSlot(key, val);
}